

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACard.cpp
# Opt level: O0

void __thiscall ACard::ACard(ACard *this,EventHandler *e)

{
  EventHandler *e_local;
  ACard *this_local;
  
  this->_vptr_ACard = (_func_int **)&PTR___cxa_pure_virtual_0010ec10;
  std::__cxx11::string::string((string *)&this->_name);
  std::__cxx11::string::string((string *)&this->_description);
  EventHandler::EventHandler(&this->_event);
  EventHandler::operator=(&this->_event,e);
  return;
}

Assistant:

ACard::ACard(EventHandler e) {
    ACard::_event = e;
}